

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O1

void * TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
       ThreadWork(void *voidptr)

{
  TPZDohrAssembleList<std::complex<double>_> *this;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> data;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> local_68;
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> local_50;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> local_48;
  
  PopItem(&local_68,
          (TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
           *)voidptr);
  if (local_68.fSubStructure.fRef != (TPZReference *)0x0) {
    do {
      if ((local_68.fSubStructure.fRef)->fPointer == (TPZDohrSubstruct<std::complex<double>_> *)0x0)
      break;
      TPZDohrSubstruct<std::complex<double>_>::Contribute_v2_local
                ((local_68.fSubStructure.fRef)->fPointer,(local_68.fInput_local.fRef)->fPointer,
                 &(local_68.fv2_local.fRef)->fPointer->fAssembleData);
      this = (TPZDohrAssembleList<std::complex<double>_> *)**(undefined8 **)((long)voidptr + 0x40);
      local_50.fRef = local_68.fv2_local.fRef;
      LOCK();
      ((local_68.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_68.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      TPZDohrAssembleList<std::complex<double>_>::AddItem(this,&local_50);
      TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::~TPZAutoPointer(&local_50);
      PopItem(&local_48,
              (TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
               *)voidptr);
      TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
      operator=(&local_68,&local_48);
      TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::~TPZAutoPointer
                (&local_48.fv2_local);
      TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_48.fInput_local);
      TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>::~TPZAutoPointer
                (&local_48.fSubStructure);
    } while (local_68.fSubStructure.fRef != (TPZReference *)0x0);
  }
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::~TPZAutoPointer(&local_68.fv2_local);
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_68.fInput_local);
  TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>::~TPZAutoPointer(&local_68.fSubStructure)
  ;
  return voidptr;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}